

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sit.c
# Opt level: O2

void attrcurse(void)

{
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  
  iVar2 = rnd(0xb);
  switch(iVar2) {
  case 1:
    if ((u.uprops[1].intrinsic >> 0x1a & 1) != 0) {
      u.uprops[1].intrinsic = u.uprops[1].intrinsic & 0xfbffffff;
      pcVar3 = "You feel warmer.";
      goto LAB_00234a8a;
    }
    break;
  case 2:
    break;
  case 3:
    goto switchD_002347c1_caseD_3;
  case 4:
    goto switchD_002347c1_caseD_4;
  case 5:
    goto switchD_002347c1_caseD_5;
  case 6:
    goto switchD_002347c1_caseD_6;
  case 7:
    goto switchD_002347c1_caseD_7;
  case 8:
    goto switchD_002347c1_caseD_8;
  case 9:
    goto switchD_002347c1_caseD_9;
  case 10:
    goto switchD_002347c1_caseD_a;
  case 0xb:
    goto switchD_002347c1_caseD_b;
  default:
    goto switchD_002347c1_default;
  }
  if ((u.uprops[0xe].intrinsic >> 0x1a & 1) != 0) {
    u.uprops[0xe].intrinsic = u.uprops[0xe].intrinsic & 0xfbffffff;
    pcVar3 = "You feel less jumpy.";
    goto LAB_00234a8a;
  }
switchD_002347c1_caseD_3:
  if ((u.uprops[6].intrinsic >> 0x1a & 1) != 0) {
    u.uprops[6].intrinsic = u.uprops[6].intrinsic & 0xfbffffff;
    pcVar3 = "You feel a little sick!";
    goto LAB_00234a8a;
  }
switchD_002347c1_caseD_4:
  if ((u.uprops[0x19].intrinsic >> 0x1a & 1) == 0) {
switchD_002347c1_caseD_5:
    if ((u.uprops[2].intrinsic >> 0x1a & 1) == 0) {
switchD_002347c1_caseD_6:
      if ((u.uprops[0xd].intrinsic >> 0x1a & 1) == 0) {
switchD_002347c1_caseD_7:
        if ((u.uprops[0xc].intrinsic >> 0x1a & 1) != 0) {
          u.uprops[0xc].intrinsic = u.uprops[0xc].intrinsic & 0xfbffffff;
          pcVar3 = "thought you saw something";
          if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
            if (u.umonnum == u.umonster) {
              pcVar3 = "tawt you taw a puttie tat";
            }
            else {
              bVar1 = dmgtype(youmonst.data,0x24);
              pcVar3 = "thought you saw something";
              if (bVar1 == '\0') {
                pcVar3 = "tawt you taw a puttie tat";
              }
            }
          }
          pline("You %s!",pcVar3);
          return;
        }
switchD_002347c1_caseD_8:
        if ((u.uprops[0x1a].intrinsic >> 0x1a & 1) == 0) {
switchD_002347c1_caseD_9:
          if ((u.uprops[0x13].intrinsic >> 0x1a & 1) == 0) {
switchD_002347c1_caseD_a:
            if ((u.uprops[0x16].intrinsic >> 0x1a & 1) == 0) {
switchD_002347c1_caseD_b:
              if ((u.uprops[0x14].intrinsic >> 0x1a & 1) != 0) {
                u.uprops[0x14].intrinsic = u.uprops[0x14].intrinsic & 0xfbffffff;
                pcVar3 = "You feel less attractive.";
                goto LAB_00234a8a;
              }
            }
            else {
              u.uprops[0x16].intrinsic = u.uprops[0x16].intrinsic & 0xfbffffff;
              pline("You feel vulnerable.");
              u.ublessed = 0;
            }
switchD_002347c1_default:
            return;
          }
          u.uprops[0x13].intrinsic = u.uprops[0x13].intrinsic & 0xfbffffff;
          pcVar3 = "You feel clumsy.";
        }
        else {
          u.uprops[0x1a].intrinsic = u.uprops[0x1a].intrinsic & 0xfbffffff;
          pcVar3 = "You feel slower.";
        }
      }
      else {
        u.uprops[0xd].intrinsic = u.uprops[0xd].intrinsic & 0xfbffffff;
        pcVar3 = "You feel paranoid.";
      }
    }
    else {
      u.uprops[2].intrinsic = u.uprops[2].intrinsic & 0xfbffffff;
      pcVar3 = "You feel cooler.";
    }
    goto LAB_00234a8a;
  }
  u.uprops[0x19].intrinsic = u.uprops[0x19].intrinsic & 0xfbffffff;
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_002349b8;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_002349b3;
  }
  else {
LAB_002349b3:
    if (ublindf != (obj *)0x0) {
LAB_002349b8:
      if (ublindf->oartifact == '\x1d') goto LAB_00234a83;
    }
    if ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
         (u.uprops[0x19].intrinsic == 0 && u.uprops[0x19].extrinsic == 0)) &&
         youmonst.data != mons + 0x32) || (u.uprops[0x19].blocked != 0)) {
      see_monsters();
    }
  }
LAB_00234a83:
  pcVar3 = "Your senses fail!";
LAB_00234a8a:
  pline(pcVar3);
  return;
}

Assistant:

void attrcurse(void)
{
	switch(rnd(11)) {
	case 1 : if (HFire_resistance & FROMOUTSIDE) {
			HFire_resistance &= ~FROMOUTSIDE;
			pline("You feel warmer.");
			break;
		}
	case 2 : if (HTeleportation & FROMOUTSIDE) {
			HTeleportation &= ~FROMOUTSIDE;
			pline("You feel less jumpy.");
			break;
		}
	case 3 : if (HPoison_resistance & FROMOUTSIDE) {
			HPoison_resistance &= ~FROMOUTSIDE;
			pline("You feel a little sick!");
			break;
		}
	case 4 : if (HTelepat & FROMOUTSIDE) {
			HTelepat &= ~FROMOUTSIDE;
			if (Blind && !Blind_telepat)
			    see_monsters();	/* Can't sense mons anymore! */
			pline("Your senses fail!");
			break;
		}
	case 5 : if (HCold_resistance & FROMOUTSIDE) {
			HCold_resistance &= ~FROMOUTSIDE;
			pline("You feel cooler.");
			break;
		}
	case 6 : if (HInvis & FROMOUTSIDE) {
			HInvis &= ~FROMOUTSIDE;
			pline("You feel paranoid.");
			break;
		}
	case 7 : if (HSee_invisible & FROMOUTSIDE) {
			HSee_invisible &= ~FROMOUTSIDE;
			pline("You %s!", Hallucination ? "tawt you taw a puttie tat"
						: "thought you saw something");
			break;
		}
	case 8 : if (HFast & FROMOUTSIDE) {
			HFast &= ~FROMOUTSIDE;
			pline("You feel slower.");
			break;
		}
	case 9 : if (HStealth & FROMOUTSIDE) {
			HStealth &= ~FROMOUTSIDE;
			pline("You feel clumsy.");
			break;
		}
	case 10: if (HProtection & FROMOUTSIDE) {
			HProtection &= ~FROMOUTSIDE;
			pline("You feel vulnerable.");
			u.ublessed = 0;
			break;
		}
	case 11: if (HAggravate_monster & FROMOUTSIDE) {
			HAggravate_monster &= ~FROMOUTSIDE;
			pline("You feel less attractive.");
			break;
		}
	default: break;
	}
}